

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  ulong uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  uint uVar55;
  uint uVar56;
  long lVar57;
  Scene *pSVar58;
  ulong uVar59;
  undefined1 (*pauVar60) [16];
  ulong uVar61;
  long lVar62;
  undefined1 (*pauVar63) [16];
  long lVar64;
  ulong uVar65;
  undefined1 (*pauVar66) [16];
  undefined1 (*pauVar67) [16];
  ulong uVar68;
  undefined4 uVar69;
  ulong unaff_R12;
  ulong uVar70;
  ulong uVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar78 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 extraout_var [56];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar91 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar105;
  float fVar106;
  undefined1 auVar102 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  float fVar119;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar123 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2a10;
  undefined8 uStack_2a08;
  undefined8 *local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  ulong local_29e8;
  Scene *local_29e0;
  undefined1 auStack_29d8 [24];
  RTCFilterFunctionNArguments local_29b0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  RTCHitN local_28b0 [16];
  undefined1 local_28a0 [16];
  undefined1 local_2890 [16];
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined1 local_2850 [16];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  float local_26e0 [4];
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar67 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2560._4_4_ = uVar69;
  local_2560._0_4_ = uVar69;
  local_2560._8_4_ = uVar69;
  local_2560._12_4_ = uVar69;
  local_2560._16_4_ = uVar69;
  local_2560._20_4_ = uVar69;
  local_2560._24_4_ = uVar69;
  local_2560._28_4_ = uVar69;
  auVar112 = ZEXT3264(local_2560);
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2580._4_4_ = uVar69;
  local_2580._0_4_ = uVar69;
  local_2580._8_4_ = uVar69;
  local_2580._12_4_ = uVar69;
  local_2580._16_4_ = uVar69;
  local_2580._20_4_ = uVar69;
  local_2580._24_4_ = uVar69;
  local_2580._28_4_ = uVar69;
  auVar116 = ZEXT3264(local_2580);
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_25a0._4_4_ = uVar69;
  local_25a0._0_4_ = uVar69;
  local_25a0._8_4_ = uVar69;
  local_25a0._12_4_ = uVar69;
  local_25a0._16_4_ = uVar69;
  local_25a0._20_4_ = uVar69;
  local_25a0._24_4_ = uVar69;
  local_25a0._28_4_ = uVar69;
  auVar118 = ZEXT3264(local_25a0);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar25 = fVar1 * 0.99999964;
  local_25c0._4_4_ = fVar25;
  local_25c0._0_4_ = fVar25;
  local_25c0._8_4_ = fVar25;
  local_25c0._12_4_ = fVar25;
  local_25c0._16_4_ = fVar25;
  local_25c0._20_4_ = fVar25;
  local_25c0._24_4_ = fVar25;
  local_25c0._28_4_ = fVar25;
  auVar123 = ZEXT3264(local_25c0);
  fVar25 = fVar2 * 0.99999964;
  local_25e0._4_4_ = fVar25;
  local_25e0._0_4_ = fVar25;
  local_25e0._8_4_ = fVar25;
  local_25e0._12_4_ = fVar25;
  local_25e0._16_4_ = fVar25;
  local_25e0._20_4_ = fVar25;
  local_25e0._24_4_ = fVar25;
  local_25e0._28_4_ = fVar25;
  auVar131 = ZEXT3264(local_25e0);
  fVar25 = fVar3 * 0.99999964;
  local_2600._4_4_ = fVar25;
  local_2600._0_4_ = fVar25;
  local_2600._8_4_ = fVar25;
  local_2600._12_4_ = fVar25;
  local_2600._16_4_ = fVar25;
  local_2600._20_4_ = fVar25;
  local_2600._24_4_ = fVar25;
  local_2600._28_4_ = fVar25;
  auVar134 = ZEXT3264(local_2600);
  fVar1 = fVar1 * 1.0000004;
  local_2620._4_4_ = fVar1;
  local_2620._0_4_ = fVar1;
  local_2620._8_4_ = fVar1;
  local_2620._12_4_ = fVar1;
  local_2620._16_4_ = fVar1;
  local_2620._20_4_ = fVar1;
  local_2620._24_4_ = fVar1;
  local_2620._28_4_ = fVar1;
  auVar135 = ZEXT3264(local_2620);
  fVar2 = fVar2 * 1.0000004;
  local_2640._4_4_ = fVar2;
  local_2640._0_4_ = fVar2;
  local_2640._8_4_ = fVar2;
  local_2640._12_4_ = fVar2;
  local_2640._16_4_ = fVar2;
  local_2640._20_4_ = fVar2;
  local_2640._24_4_ = fVar2;
  local_2640._28_4_ = fVar2;
  auVar137 = ZEXT3264(local_2640);
  fVar3 = fVar3 * 1.0000004;
  local_2660._4_4_ = fVar3;
  local_2660._0_4_ = fVar3;
  local_2660._8_4_ = fVar3;
  local_2660._12_4_ = fVar3;
  local_2660._16_4_ = fVar3;
  local_2660._20_4_ = fVar3;
  local_2660._24_4_ = fVar3;
  local_2660._28_4_ = fVar3;
  auVar139 = ZEXT3264(local_2660);
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_29e8 = uVar68 ^ 0x20;
  local_29f0 = uVar59 ^ 0x20;
  local_29f8 = uVar65 ^ 0x20;
  iVar54 = (tray->tnear).field_0.i[k];
  local_2940._4_4_ = iVar54;
  local_2940._0_4_ = iVar54;
  local_2940._8_4_ = iVar54;
  local_2940._12_4_ = iVar54;
  local_2940._16_4_ = iVar54;
  local_2940._20_4_ = iVar54;
  local_2940._24_4_ = iVar54;
  local_2940._28_4_ = iVar54;
  auVar141 = ZEXT3264(local_2940);
  iVar54 = (tray->tfar).field_0.i[k];
  auVar75 = ZEXT3264(CONCAT428(iVar54,CONCAT424(iVar54,CONCAT420(iVar54,CONCAT416(iVar54,CONCAT412(
                                                  iVar54,CONCAT48(iVar54,CONCAT44(iVar54,iVar54)))))
                                               )));
  local_2520._16_16_ = mm_lookupmask_ps._240_16_;
  local_2520._0_16_ = mm_lookupmask_ps._0_16_;
  local_2a00 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar93._8_4_ = 0x3f800000;
  auVar93._0_8_ = &DAT_3f8000003f800000;
  auVar93._12_4_ = 0x3f800000;
  auVar93._16_4_ = 0x3f800000;
  auVar93._20_4_ = 0x3f800000;
  auVar93._24_4_ = 0x3f800000;
  auVar93._28_4_ = 0x3f800000;
  auVar80._8_4_ = 0xbf800000;
  auVar80._0_8_ = 0xbf800000bf800000;
  auVar80._12_4_ = 0xbf800000;
  auVar80._16_4_ = 0xbf800000;
  auVar80._20_4_ = 0xbf800000;
  auVar80._24_4_ = 0xbf800000;
  auVar80._28_4_ = 0xbf800000;
  _local_2540 = vblendvps_avx(auVar93,auVar80,local_2520);
  do {
    do {
      do {
        if (pauVar67 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar66 = pauVar67 + -1;
        pauVar67 = pauVar67 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar66 + 8));
      uVar71 = *(ulong *)*pauVar67;
      do {
        auVar86 = auVar118._0_32_;
        auVar93 = auVar116._0_32_;
        auVar80 = auVar112._0_32_;
        if ((uVar71 & 8) == 0) {
          auVar94 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar68),auVar80);
          auVar26._4_4_ = auVar123._4_4_ * auVar94._4_4_;
          auVar26._0_4_ = auVar123._0_4_ * auVar94._0_4_;
          auVar26._8_4_ = auVar123._8_4_ * auVar94._8_4_;
          auVar26._12_4_ = auVar123._12_4_ * auVar94._12_4_;
          auVar26._16_4_ = auVar123._16_4_ * auVar94._16_4_;
          auVar26._20_4_ = auVar123._20_4_ * auVar94._20_4_;
          auVar26._24_4_ = auVar123._24_4_ * auVar94._24_4_;
          auVar26._28_4_ = auVar94._28_4_;
          auVar94 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar59),auVar93);
          auVar27._4_4_ = auVar131._4_4_ * auVar94._4_4_;
          auVar27._0_4_ = auVar131._0_4_ * auVar94._0_4_;
          auVar27._8_4_ = auVar131._8_4_ * auVar94._8_4_;
          auVar27._12_4_ = auVar131._12_4_ * auVar94._12_4_;
          auVar27._16_4_ = auVar131._16_4_ * auVar94._16_4_;
          auVar27._20_4_ = auVar131._20_4_ * auVar94._20_4_;
          auVar27._24_4_ = auVar131._24_4_ * auVar94._24_4_;
          auVar27._28_4_ = auVar94._28_4_;
          auVar94 = vmaxps_avx(auVar26,auVar27);
          auVar26 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar65),auVar86);
          auVar28._4_4_ = auVar134._4_4_ * auVar26._4_4_;
          auVar28._0_4_ = auVar134._0_4_ * auVar26._0_4_;
          auVar28._8_4_ = auVar134._8_4_ * auVar26._8_4_;
          auVar28._12_4_ = auVar134._12_4_ * auVar26._12_4_;
          auVar28._16_4_ = auVar134._16_4_ * auVar26._16_4_;
          auVar28._20_4_ = auVar134._20_4_ * auVar26._20_4_;
          auVar28._24_4_ = auVar134._24_4_ * auVar26._24_4_;
          auVar28._28_4_ = auVar26._28_4_;
          auVar26 = vmaxps_avx(auVar28,auVar141._0_32_);
          local_2820 = vmaxps_avx(auVar94,auVar26);
          auVar94 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + local_29e8),auVar80);
          auVar29._4_4_ = auVar135._4_4_ * auVar94._4_4_;
          auVar29._0_4_ = auVar135._0_4_ * auVar94._0_4_;
          auVar29._8_4_ = auVar135._8_4_ * auVar94._8_4_;
          auVar29._12_4_ = auVar135._12_4_ * auVar94._12_4_;
          auVar29._16_4_ = auVar135._16_4_ * auVar94._16_4_;
          auVar29._20_4_ = auVar135._20_4_ * auVar94._20_4_;
          auVar29._24_4_ = auVar135._24_4_ * auVar94._24_4_;
          auVar29._28_4_ = auVar94._28_4_;
          auVar94 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + local_29f0),auVar93);
          auVar31._4_4_ = auVar137._4_4_ * auVar94._4_4_;
          auVar31._0_4_ = auVar137._0_4_ * auVar94._0_4_;
          auVar31._8_4_ = auVar137._8_4_ * auVar94._8_4_;
          auVar31._12_4_ = auVar137._12_4_ * auVar94._12_4_;
          auVar31._16_4_ = auVar137._16_4_ * auVar94._16_4_;
          auVar31._20_4_ = auVar137._20_4_ * auVar94._20_4_;
          auVar31._24_4_ = auVar137._24_4_ * auVar94._24_4_;
          auVar31._28_4_ = auVar94._28_4_;
          auVar94 = vminps_avx(auVar29,auVar31);
          auVar26 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + local_29f8),auVar86);
          auVar32._4_4_ = auVar139._4_4_ * auVar26._4_4_;
          auVar32._0_4_ = auVar139._0_4_ * auVar26._0_4_;
          auVar32._8_4_ = auVar139._8_4_ * auVar26._8_4_;
          auVar32._12_4_ = auVar139._12_4_ * auVar26._12_4_;
          auVar32._16_4_ = auVar139._16_4_ * auVar26._16_4_;
          auVar32._20_4_ = auVar139._20_4_ * auVar26._20_4_;
          auVar32._24_4_ = auVar139._24_4_ * auVar26._24_4_;
          auVar32._28_4_ = auVar26._28_4_;
          auVar26 = vminps_avx(auVar32,auVar75._0_32_);
          auVar94 = vminps_avx(auVar94,auVar26);
          auVar94 = vcmpps_avx(local_2820,auVar94,2);
          uVar69 = vmovmskps_avx(auVar94);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar69);
        }
        if ((uVar71 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar54 = 4;
          }
          else {
            uVar70 = uVar71 & 0xfffffffffffffff0;
            lVar64 = 0;
            for (uVar71 = unaff_R12; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
              lVar64 = lVar64 + 1;
            }
            iVar54 = 0;
            uVar61 = unaff_R12 - 1 & unaff_R12;
            uVar71 = *(ulong *)(uVar70 + lVar64 * 8);
            if (uVar61 != 0) {
              uVar56 = *(uint *)(local_2820 + lVar64 * 4);
              lVar64 = 0;
              for (uVar30 = uVar61; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                lVar64 = lVar64 + 1;
              }
              uVar61 = uVar61 - 1 & uVar61;
              uVar30 = *(ulong *)(uVar70 + lVar64 * 8);
              uVar55 = *(uint *)(local_2820 + lVar64 * 4);
              if (uVar61 == 0) {
                if (uVar56 < uVar55) {
                  *(ulong *)*pauVar67 = uVar30;
                  *(uint *)(*pauVar67 + 8) = uVar55;
                  pauVar67 = pauVar67 + 1;
                }
                else {
                  *(ulong *)*pauVar67 = uVar71;
                  *(uint *)(*pauVar67 + 8) = uVar56;
                  pauVar67 = pauVar67 + 1;
                  uVar71 = uVar30;
                }
              }
              else {
                auVar76._8_8_ = 0;
                auVar76._0_8_ = uVar71;
                auVar76 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar56));
                auVar88._8_8_ = 0;
                auVar88._0_8_ = uVar30;
                auVar88 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar55));
                lVar64 = 0;
                for (uVar71 = uVar61; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000)
                {
                  lVar64 = lVar64 + 1;
                }
                uVar61 = uVar61 - 1 & uVar61;
                auVar91._8_8_ = 0;
                auVar91._0_8_ = *(ulong *)(uVar70 + lVar64 * 8);
                auVar77 = vpunpcklqdq_avx(auVar91,ZEXT416(*(uint *)(local_2820 + lVar64 * 4)));
                auVar91 = vpcmpgtd_avx(auVar88,auVar76);
                if (uVar61 == 0) {
                  auVar102 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar88,auVar76,auVar102);
                  auVar76 = vblendvps_avx(auVar76,auVar88,auVar102);
                  auVar88 = vpcmpgtd_avx(auVar77,auVar91);
                  auVar102 = vpshufd_avx(auVar88,0xaa);
                  auVar88 = vblendvps_avx(auVar77,auVar91,auVar102);
                  auVar91 = vblendvps_avx(auVar91,auVar77,auVar102);
                  auVar77 = vpcmpgtd_avx(auVar91,auVar76);
                  auVar102 = vpshufd_avx(auVar77,0xaa);
                  auVar77 = vblendvps_avx(auVar91,auVar76,auVar102);
                  auVar76 = vblendvps_avx(auVar76,auVar91,auVar102);
                  *pauVar67 = auVar76;
                  pauVar67[1] = auVar77;
                  uVar71 = auVar88._0_8_;
                  pauVar67 = pauVar67 + 2;
                }
                else {
                  lVar64 = 0;
                  for (uVar71 = uVar61; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000
                      ) {
                    lVar64 = lVar64 + 1;
                  }
                  uVar61 = uVar61 - 1 & uVar61;
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = *(ulong *)(uVar70 + lVar64 * 8);
                  auVar102 = vpunpcklqdq_avx(auVar102,ZEXT416(*(uint *)(local_2820 + lVar64 * 4)));
                  if (uVar61 == 0) {
                    auVar78 = vpshufd_avx(auVar91,0xaa);
                    auVar91 = vblendvps_avx(auVar88,auVar76,auVar78);
                    auVar76 = vblendvps_avx(auVar76,auVar88,auVar78);
                    auVar88 = vpcmpgtd_avx(auVar102,auVar77);
                    auVar78 = vpshufd_avx(auVar88,0xaa);
                    auVar88 = vblendvps_avx(auVar102,auVar77,auVar78);
                    auVar77 = vblendvps_avx(auVar77,auVar102,auVar78);
                    auVar102 = vpcmpgtd_avx(auVar77,auVar76);
                    auVar78 = vpshufd_avx(auVar102,0xaa);
                    auVar102 = vblendvps_avx(auVar77,auVar76,auVar78);
                    auVar76 = vblendvps_avx(auVar76,auVar77,auVar78);
                    auVar77 = vpcmpgtd_avx(auVar88,auVar91);
                    auVar78 = vpshufd_avx(auVar77,0xaa);
                    auVar77 = vblendvps_avx(auVar88,auVar91,auVar78);
                    auVar88 = vblendvps_avx(auVar91,auVar88,auVar78);
                    auVar91 = vpcmpgtd_avx(auVar102,auVar88);
                    auVar78 = vpshufd_avx(auVar91,0xaa);
                    auVar91 = vblendvps_avx(auVar102,auVar88,auVar78);
                    auVar88 = vblendvps_avx(auVar88,auVar102,auVar78);
                    *pauVar67 = auVar76;
                    pauVar67[1] = auVar88;
                    pauVar67[2] = auVar91;
                    uVar71 = auVar77._0_8_;
                    pauVar66 = pauVar67 + 3;
                  }
                  else {
                    *pauVar67 = auVar76;
                    pauVar67[1] = auVar88;
                    pauVar67[2] = auVar77;
                    pauVar67[3] = auVar102;
                    lVar64 = 0x30;
                    do {
                      lVar62 = lVar64;
                      lVar64 = 0;
                      for (uVar71 = uVar61; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        lVar64 = lVar64 + 1;
                      }
                      auVar77._8_8_ = 0;
                      auVar77._0_8_ = *(ulong *)(uVar70 + lVar64 * 8);
                      auVar76 = vpunpcklqdq_avx(auVar77,ZEXT416(*(uint *)(local_2820 + lVar64 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar67[1] + lVar62) = auVar76;
                      uVar61 = uVar61 - 1 & uVar61;
                      lVar64 = lVar62 + 0x10;
                    } while (uVar61 != 0);
                    pauVar66 = (undefined1 (*) [16])(pauVar67[1] + lVar62);
                    if (lVar62 + 0x10 != 0) {
                      lVar64 = 0x10;
                      pauVar60 = pauVar67;
                      do {
                        auVar76 = pauVar60[1];
                        uVar56 = *(uint *)(pauVar60[1] + 8);
                        pauVar60 = pauVar60 + 1;
                        lVar62 = lVar64;
                        do {
                          if (uVar56 <= *(uint *)(pauVar67[-1] + lVar62 + 8)) {
                            pauVar63 = (undefined1 (*) [16])(*pauVar67 + lVar62);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar67 + lVar62) =
                               *(undefined1 (*) [16])(pauVar67[-1] + lVar62);
                          lVar62 = lVar62 + -0x10;
                          pauVar63 = pauVar67;
                        } while (lVar62 != 0);
                        *pauVar63 = auVar76;
                        lVar64 = lVar64 + 0x10;
                      } while (pauVar66 != pauVar60);
                    }
                    uVar71 = *(ulong *)*pauVar66;
                  }
                  auVar112 = ZEXT3264(auVar80);
                  auVar116 = ZEXT3264(auVar93);
                  auVar118 = ZEXT3264(auVar86);
                  auVar123 = ZEXT3264(auVar123._0_32_);
                  auVar131 = ZEXT3264(auVar131._0_32_);
                  auVar134 = ZEXT3264(auVar134._0_32_);
                  auVar135 = ZEXT3264(auVar135._0_32_);
                  auVar137 = ZEXT3264(auVar137._0_32_);
                  auVar139 = ZEXT3264(auVar139._0_32_);
                  auVar141 = ZEXT3264(local_2940);
                  pauVar67 = pauVar66;
                  iVar54 = 0;
                }
              }
            }
          }
        }
        else {
          iVar54 = 6;
        }
      } while (iVar54 == 0);
    } while (iVar54 != 6);
    uVar70 = (ulong)((uint)uVar71 & 0xf);
    if (uVar70 != 8) {
      uVar71 = uVar71 & 0xfffffffffffffff0;
      lVar64 = 0;
      do {
        lVar57 = lVar64 * 0xe0;
        lVar62 = uVar71 + 0xd0 + lVar57;
        local_28e0 = *(undefined8 *)(lVar62 + 0x10);
        uStack_28d8 = *(undefined8 *)(lVar62 + 0x18);
        lVar62 = uVar71 + 0xc0 + lVar57;
        local_23c0 = *(undefined8 *)(lVar62 + 0x10);
        uStack_23b8 = *(undefined8 *)(lVar62 + 0x18);
        uStack_23b0 = local_23c0;
        uStack_23a8 = uStack_23b8;
        uStack_28d0 = local_28e0;
        uStack_28c8 = uStack_28d8;
        auVar94._16_16_ = *(undefined1 (*) [16])(uVar71 + 0x60 + lVar57);
        auVar94._0_16_ = *(undefined1 (*) [16])(uVar71 + lVar57);
        auVar81._16_16_ = *(undefined1 (*) [16])(uVar71 + 0x70 + lVar57);
        auVar81._0_16_ = *(undefined1 (*) [16])(uVar71 + 0x10 + lVar57);
        auVar89._16_16_ = *(undefined1 (*) [16])(uVar71 + 0x80 + lVar57);
        auVar89._0_16_ = *(undefined1 (*) [16])(uVar71 + 0x20 + lVar57);
        auVar76 = *(undefined1 (*) [16])(uVar71 + 0x30 + lVar57);
        auVar111._16_16_ = auVar76;
        auVar111._0_16_ = auVar76;
        auVar76 = *(undefined1 (*) [16])(uVar71 + 0x40 + lVar57);
        auVar97._16_16_ = auVar76;
        auVar97._0_16_ = auVar76;
        auVar76 = *(undefined1 (*) [16])(uVar71 + 0x50 + lVar57);
        auVar103._16_16_ = auVar76;
        auVar103._0_16_ = auVar76;
        auVar76 = *(undefined1 (*) [16])(uVar71 + 0x90 + lVar57);
        auVar113._16_16_ = auVar76;
        auVar113._0_16_ = auVar76;
        auVar76 = *(undefined1 (*) [16])(uVar71 + 0xa0 + lVar57);
        auVar140._16_16_ = auVar76;
        auVar140._0_16_ = auVar76;
        auVar76 = *(undefined1 (*) [16])(uVar71 + 0xb0 + lVar57);
        auVar72._16_16_ = auVar76;
        auVar72._0_16_ = auVar76;
        uVar69 = *(undefined4 *)(ray + k * 4);
        auVar132._4_4_ = uVar69;
        auVar132._0_4_ = uVar69;
        auVar132._8_4_ = uVar69;
        auVar132._12_4_ = uVar69;
        auVar132._16_4_ = uVar69;
        auVar132._20_4_ = uVar69;
        auVar132._24_4_ = uVar69;
        auVar132._28_4_ = uVar69;
        uVar69 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar136._4_4_ = uVar69;
        auVar136._0_4_ = uVar69;
        auVar136._8_4_ = uVar69;
        auVar136._12_4_ = uVar69;
        auVar136._16_4_ = uVar69;
        auVar136._20_4_ = uVar69;
        auVar136._24_4_ = uVar69;
        auVar136._28_4_ = uVar69;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar138._4_4_ = uVar4;
        auVar138._0_4_ = uVar4;
        auVar138._8_4_ = uVar4;
        auVar138._12_4_ = uVar4;
        auVar138._16_4_ = uVar4;
        auVar138._20_4_ = uVar4;
        auVar138._24_4_ = uVar4;
        auVar138._28_4_ = uVar4;
        auVar94 = vsubps_avx(auVar94,auVar132);
        local_2900 = vsubps_avx(auVar81,auVar136);
        local_2920 = vsubps_avx(auVar89,auVar138);
        auVar80 = vsubps_avx(auVar111,auVar132);
        auVar93 = vsubps_avx(auVar97,auVar136);
        auVar86 = vsubps_avx(auVar103,auVar138);
        auVar26 = vsubps_avx(auVar113,auVar132);
        auVar27 = vsubps_avx(auVar140,auVar136);
        auVar28 = vsubps_avx(auVar72,auVar138);
        local_23e0 = vsubps_avx(auVar26,auVar94);
        local_2420 = vsubps_avx(auVar27,local_2900);
        local_2400 = vsubps_avx(auVar28,local_2920);
        auVar73._0_4_ = auVar94._0_4_ + auVar26._0_4_;
        auVar73._4_4_ = auVar94._4_4_ + auVar26._4_4_;
        auVar73._8_4_ = auVar94._8_4_ + auVar26._8_4_;
        auVar73._12_4_ = auVar94._12_4_ + auVar26._12_4_;
        auVar73._16_4_ = auVar94._16_4_ + auVar26._16_4_;
        auVar73._20_4_ = auVar94._20_4_ + auVar26._20_4_;
        auVar73._24_4_ = auVar94._24_4_ + auVar26._24_4_;
        auVar73._28_4_ = auVar94._28_4_ + auVar26._28_4_;
        auVar114._0_4_ = auVar27._0_4_ + local_2900._0_4_;
        auVar114._4_4_ = auVar27._4_4_ + local_2900._4_4_;
        auVar114._8_4_ = auVar27._8_4_ + local_2900._8_4_;
        auVar114._12_4_ = auVar27._12_4_ + local_2900._12_4_;
        auVar114._16_4_ = auVar27._16_4_ + local_2900._16_4_;
        auVar114._20_4_ = auVar27._20_4_ + local_2900._20_4_;
        auVar114._24_4_ = auVar27._24_4_ + local_2900._24_4_;
        auVar114._28_4_ = auVar27._28_4_ + local_2900._28_4_;
        fVar1 = local_2920._0_4_;
        auVar98._0_4_ = auVar28._0_4_ + fVar1;
        fVar2 = local_2920._4_4_;
        auVar98._4_4_ = auVar28._4_4_ + fVar2;
        fVar3 = local_2920._8_4_;
        auVar98._8_4_ = auVar28._8_4_ + fVar3;
        fVar25 = local_2920._12_4_;
        auVar98._12_4_ = auVar28._12_4_ + fVar25;
        fVar7 = local_2920._16_4_;
        auVar98._16_4_ = auVar28._16_4_ + fVar7;
        fVar8 = local_2920._20_4_;
        auVar98._20_4_ = auVar28._20_4_ + fVar8;
        fVar9 = local_2920._24_4_;
        auVar98._24_4_ = auVar28._24_4_ + fVar9;
        fVar124 = auVar28._28_4_;
        auVar98._28_4_ = fVar124 + local_2920._28_4_;
        auVar33._4_4_ = local_2400._4_4_ * auVar114._4_4_;
        auVar33._0_4_ = local_2400._0_4_ * auVar114._0_4_;
        auVar33._8_4_ = local_2400._8_4_ * auVar114._8_4_;
        auVar33._12_4_ = local_2400._12_4_ * auVar114._12_4_;
        auVar33._16_4_ = local_2400._16_4_ * auVar114._16_4_;
        auVar33._20_4_ = local_2400._20_4_ * auVar114._20_4_;
        auVar33._24_4_ = local_2400._24_4_ * auVar114._24_4_;
        auVar33._28_4_ = uVar69;
        auVar88 = vfmsub231ps_fma(auVar33,local_2420,auVar98);
        auVar34._4_4_ = local_23e0._4_4_ * auVar98._4_4_;
        auVar34._0_4_ = local_23e0._0_4_ * auVar98._0_4_;
        auVar34._8_4_ = local_23e0._8_4_ * auVar98._8_4_;
        auVar34._12_4_ = local_23e0._12_4_ * auVar98._12_4_;
        auVar34._16_4_ = local_23e0._16_4_ * auVar98._16_4_;
        auVar34._20_4_ = local_23e0._20_4_ * auVar98._20_4_;
        auVar34._24_4_ = local_23e0._24_4_ * auVar98._24_4_;
        auVar34._28_4_ = auVar98._28_4_;
        auVar76 = vfmsub231ps_fma(auVar34,local_2400,auVar73);
        auVar35._4_4_ = local_2420._4_4_ * auVar73._4_4_;
        auVar35._0_4_ = local_2420._0_4_ * auVar73._0_4_;
        auVar35._8_4_ = local_2420._8_4_ * auVar73._8_4_;
        auVar35._12_4_ = local_2420._12_4_ * auVar73._12_4_;
        auVar35._16_4_ = local_2420._16_4_ * auVar73._16_4_;
        auVar35._20_4_ = local_2420._20_4_ * auVar73._20_4_;
        auVar35._24_4_ = local_2420._24_4_ * auVar73._24_4_;
        auVar35._28_4_ = auVar73._28_4_;
        auVar91 = vfmsub231ps_fma(auVar35,local_23e0,auVar114);
        uVar69 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar133._4_4_ = uVar69;
        auVar133._0_4_ = uVar69;
        auVar133._8_4_ = uVar69;
        auVar133._12_4_ = uVar69;
        auVar133._16_4_ = uVar69;
        auVar133._20_4_ = uVar69;
        auVar133._24_4_ = uVar69;
        auVar133._28_4_ = uVar69;
        local_2460 = *(float *)(ray + k * 4 + 0x60);
        auVar36._4_4_ = local_2460 * auVar91._4_4_;
        auVar36._0_4_ = local_2460 * auVar91._0_4_;
        auVar36._8_4_ = local_2460 * auVar91._8_4_;
        auVar36._12_4_ = local_2460 * auVar91._12_4_;
        auVar36._16_4_ = local_2460 * 0.0;
        auVar36._20_4_ = local_2460 * 0.0;
        auVar36._24_4_ = local_2460 * 0.0;
        auVar36._28_4_ = fVar124;
        auVar76 = vfmadd231ps_fma(auVar36,auVar133,ZEXT1632(auVar76));
        uVar69 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_2440._4_4_ = uVar69;
        local_2440._0_4_ = uVar69;
        local_2440._8_4_ = uVar69;
        local_2440._12_4_ = uVar69;
        local_2440._16_4_ = uVar69;
        local_2440._20_4_ = uVar69;
        local_2440._24_4_ = uVar69;
        local_2440._28_4_ = uVar69;
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_2440,ZEXT1632(auVar88));
        local_2480 = vsubps_avx(local_2900,auVar93);
        local_24a0 = vsubps_avx(local_2920,auVar86);
        auVar82._0_4_ = auVar93._0_4_ + local_2900._0_4_;
        auVar82._4_4_ = auVar93._4_4_ + local_2900._4_4_;
        auVar82._8_4_ = auVar93._8_4_ + local_2900._8_4_;
        auVar82._12_4_ = auVar93._12_4_ + local_2900._12_4_;
        auVar82._16_4_ = auVar93._16_4_ + local_2900._16_4_;
        auVar82._20_4_ = auVar93._20_4_ + local_2900._20_4_;
        auVar82._24_4_ = auVar93._24_4_ + local_2900._24_4_;
        auVar82._28_4_ = auVar93._28_4_ + local_2900._28_4_;
        auVar99._0_4_ = fVar1 + auVar86._0_4_;
        auVar99._4_4_ = fVar2 + auVar86._4_4_;
        auVar99._8_4_ = fVar3 + auVar86._8_4_;
        auVar99._12_4_ = fVar25 + auVar86._12_4_;
        auVar99._16_4_ = fVar7 + auVar86._16_4_;
        auVar99._20_4_ = fVar8 + auVar86._20_4_;
        auVar99._24_4_ = fVar9 + auVar86._24_4_;
        fVar119 = auVar86._28_4_;
        auVar99._28_4_ = local_2920._28_4_ + fVar119;
        fVar105 = local_24a0._0_4_;
        fVar108 = local_24a0._4_4_;
        auVar37._4_4_ = auVar82._4_4_ * fVar108;
        auVar37._0_4_ = auVar82._0_4_ * fVar105;
        fVar10 = local_24a0._8_4_;
        auVar37._8_4_ = auVar82._8_4_ * fVar10;
        fVar13 = local_24a0._12_4_;
        auVar37._12_4_ = auVar82._12_4_ * fVar13;
        fVar16 = local_24a0._16_4_;
        auVar37._16_4_ = auVar82._16_4_ * fVar16;
        fVar19 = local_24a0._20_4_;
        auVar37._20_4_ = auVar82._20_4_ * fVar19;
        fVar22 = local_24a0._24_4_;
        auVar37._24_4_ = auVar82._24_4_ * fVar22;
        auVar37._28_4_ = auVar114._28_4_;
        auVar91 = vfmsub231ps_fma(auVar37,local_2480,auVar99);
        local_24c0 = vsubps_avx(auVar94,auVar80);
        fVar106 = local_24c0._0_4_;
        fVar109 = local_24c0._4_4_;
        auVar38._4_4_ = auVar99._4_4_ * fVar109;
        auVar38._0_4_ = auVar99._0_4_ * fVar106;
        fVar11 = local_24c0._8_4_;
        auVar38._8_4_ = auVar99._8_4_ * fVar11;
        fVar14 = local_24c0._12_4_;
        auVar38._12_4_ = auVar99._12_4_ * fVar14;
        fVar17 = local_24c0._16_4_;
        auVar38._16_4_ = auVar99._16_4_ * fVar17;
        fVar20 = local_24c0._20_4_;
        auVar38._20_4_ = auVar99._20_4_ * fVar20;
        fVar23 = local_24c0._24_4_;
        auVar38._24_4_ = auVar99._24_4_ * fVar23;
        auVar38._28_4_ = auVar99._28_4_;
        auVar120._0_4_ = auVar94._0_4_ + auVar80._0_4_;
        auVar120._4_4_ = auVar94._4_4_ + auVar80._4_4_;
        auVar120._8_4_ = auVar94._8_4_ + auVar80._8_4_;
        auVar120._12_4_ = auVar94._12_4_ + auVar80._12_4_;
        auVar120._16_4_ = auVar94._16_4_ + auVar80._16_4_;
        auVar120._20_4_ = auVar94._20_4_ + auVar80._20_4_;
        auVar120._24_4_ = auVar94._24_4_ + auVar80._24_4_;
        auVar120._28_4_ = auVar94._28_4_ + auVar80._28_4_;
        auVar88 = vfmsub231ps_fma(auVar38,local_24a0,auVar120);
        fVar107 = local_2480._0_4_;
        fVar110 = local_2480._4_4_;
        auVar39._4_4_ = auVar120._4_4_ * fVar110;
        auVar39._0_4_ = auVar120._0_4_ * fVar107;
        fVar12 = local_2480._8_4_;
        auVar39._8_4_ = auVar120._8_4_ * fVar12;
        fVar15 = local_2480._12_4_;
        auVar39._12_4_ = auVar120._12_4_ * fVar15;
        fVar18 = local_2480._16_4_;
        auVar39._16_4_ = auVar120._16_4_ * fVar18;
        fVar21 = local_2480._20_4_;
        auVar39._20_4_ = auVar120._20_4_ * fVar21;
        fVar24 = local_2480._24_4_;
        auVar39._24_4_ = auVar120._24_4_ * fVar24;
        auVar39._28_4_ = auVar120._28_4_;
        auVar77 = vfmsub231ps_fma(auVar39,local_24c0,auVar82);
        auVar121._0_4_ = auVar77._0_4_ * local_2460;
        auVar121._4_4_ = auVar77._4_4_ * local_2460;
        auVar121._8_4_ = auVar77._8_4_ * local_2460;
        auVar121._12_4_ = auVar77._12_4_ * local_2460;
        auVar121._16_4_ = local_2460 * 0.0;
        auVar121._20_4_ = local_2460 * 0.0;
        auVar121._24_4_ = local_2460 * 0.0;
        auVar121._28_4_ = 0;
        auVar88 = vfmadd231ps_fma(auVar121,auVar133,ZEXT1632(auVar88));
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_2440,ZEXT1632(auVar91));
        auVar29 = vsubps_avx(auVar80,auVar26);
        auVar95._0_4_ = auVar80._0_4_ + auVar26._0_4_;
        auVar95._4_4_ = auVar80._4_4_ + auVar26._4_4_;
        auVar95._8_4_ = auVar80._8_4_ + auVar26._8_4_;
        auVar95._12_4_ = auVar80._12_4_ + auVar26._12_4_;
        auVar95._16_4_ = auVar80._16_4_ + auVar26._16_4_;
        auVar95._20_4_ = auVar80._20_4_ + auVar26._20_4_;
        auVar95._24_4_ = auVar80._24_4_ + auVar26._24_4_;
        auVar95._28_4_ = auVar80._28_4_ + auVar26._28_4_;
        auVar26 = vsubps_avx(auVar93,auVar27);
        auVar104._0_4_ = auVar93._0_4_ + auVar27._0_4_;
        auVar104._4_4_ = auVar93._4_4_ + auVar27._4_4_;
        auVar104._8_4_ = auVar93._8_4_ + auVar27._8_4_;
        auVar104._12_4_ = auVar93._12_4_ + auVar27._12_4_;
        auVar104._16_4_ = auVar93._16_4_ + auVar27._16_4_;
        auVar104._20_4_ = auVar93._20_4_ + auVar27._20_4_;
        auVar104._24_4_ = auVar93._24_4_ + auVar27._24_4_;
        auVar104._28_4_ = auVar93._28_4_ + auVar27._28_4_;
        auVar27 = vsubps_avx(auVar86,auVar28);
        auVar83._0_4_ = auVar86._0_4_ + auVar28._0_4_;
        auVar83._4_4_ = auVar86._4_4_ + auVar28._4_4_;
        auVar83._8_4_ = auVar86._8_4_ + auVar28._8_4_;
        auVar83._12_4_ = auVar86._12_4_ + auVar28._12_4_;
        auVar83._16_4_ = auVar86._16_4_ + auVar28._16_4_;
        auVar83._20_4_ = auVar86._20_4_ + auVar28._20_4_;
        auVar83._24_4_ = auVar86._24_4_ + auVar28._24_4_;
        auVar83._28_4_ = fVar119 + fVar124;
        auVar86._4_4_ = auVar27._4_4_ * auVar104._4_4_;
        auVar86._0_4_ = auVar27._0_4_ * auVar104._0_4_;
        auVar86._8_4_ = auVar27._8_4_ * auVar104._8_4_;
        auVar86._12_4_ = auVar27._12_4_ * auVar104._12_4_;
        auVar86._16_4_ = auVar27._16_4_ * auVar104._16_4_;
        auVar86._20_4_ = auVar27._20_4_ * auVar104._20_4_;
        auVar86._24_4_ = auVar27._24_4_ * auVar104._24_4_;
        auVar86._28_4_ = fVar119;
        auVar77 = vfmsub231ps_fma(auVar86,auVar26,auVar83);
        auVar40._4_4_ = auVar83._4_4_ * auVar29._4_4_;
        auVar40._0_4_ = auVar83._0_4_ * auVar29._0_4_;
        auVar40._8_4_ = auVar83._8_4_ * auVar29._8_4_;
        auVar40._12_4_ = auVar83._12_4_ * auVar29._12_4_;
        auVar40._16_4_ = auVar83._16_4_ * auVar29._16_4_;
        auVar40._20_4_ = auVar83._20_4_ * auVar29._20_4_;
        auVar40._24_4_ = auVar83._24_4_ * auVar29._24_4_;
        auVar40._28_4_ = auVar83._28_4_;
        auVar91 = vfmsub231ps_fma(auVar40,auVar27,auVar95);
        auVar41._4_4_ = auVar26._4_4_ * auVar95._4_4_;
        auVar41._0_4_ = auVar26._0_4_ * auVar95._0_4_;
        auVar41._8_4_ = auVar26._8_4_ * auVar95._8_4_;
        auVar41._12_4_ = auVar26._12_4_ * auVar95._12_4_;
        auVar41._16_4_ = auVar26._16_4_ * auVar95._16_4_;
        auVar41._20_4_ = auVar26._20_4_ * auVar95._20_4_;
        auVar41._24_4_ = auVar26._24_4_ * auVar95._24_4_;
        auVar41._28_4_ = auVar95._28_4_;
        auVar102 = vfmsub231ps_fma(auVar41,auVar29,auVar104);
        fStack_245c = local_2460;
        fStack_2458 = local_2460;
        fStack_2454 = local_2460;
        fStack_2450 = local_2460;
        fStack_244c = local_2460;
        fStack_2448 = local_2460;
        fStack_2444 = local_2460;
        auVar96._0_4_ = local_2460 * auVar102._0_4_;
        auVar96._4_4_ = local_2460 * auVar102._4_4_;
        auVar96._8_4_ = local_2460 * auVar102._8_4_;
        auVar96._12_4_ = local_2460 * auVar102._12_4_;
        auVar96._16_4_ = local_2460 * 0.0;
        auVar96._20_4_ = local_2460 * 0.0;
        auVar96._24_4_ = local_2460 * 0.0;
        auVar96._28_4_ = 0;
        auVar91 = vfmadd231ps_fma(auVar96,auVar133,ZEXT1632(auVar91));
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_2440,ZEXT1632(auVar77));
        local_2800 = ZEXT1632(auVar88);
        local_27e0 = ZEXT1632(CONCAT412(auVar91._12_4_ + auVar88._12_4_ + auVar76._12_4_,
                                        CONCAT48(auVar91._8_4_ + auVar88._8_4_ + auVar76._8_4_,
                                                 CONCAT44(auVar91._4_4_ +
                                                          auVar88._4_4_ + auVar76._4_4_,
                                                          auVar91._0_4_ +
                                                          auVar88._0_4_ + auVar76._0_4_))));
        auVar84._8_4_ = 0x7fffffff;
        auVar84._0_8_ = 0x7fffffff7fffffff;
        auVar84._12_4_ = 0x7fffffff;
        auVar84._16_4_ = 0x7fffffff;
        auVar84._20_4_ = 0x7fffffff;
        auVar84._24_4_ = 0x7fffffff;
        auVar84._28_4_ = 0x7fffffff;
        auVar80 = vminps_avx(ZEXT1632(auVar76),local_2800);
        auVar80 = vminps_avx(auVar80,ZEXT1632(auVar91));
        local_2500 = vandps_avx(local_27e0,auVar84);
        fVar119 = local_2500._0_4_ * 1.1920929e-07;
        fVar124 = local_2500._4_4_ * 1.1920929e-07;
        auVar42._4_4_ = fVar124;
        auVar42._0_4_ = fVar119;
        fVar125 = local_2500._8_4_ * 1.1920929e-07;
        auVar42._8_4_ = fVar125;
        fVar126 = local_2500._12_4_ * 1.1920929e-07;
        auVar42._12_4_ = fVar126;
        fVar127 = local_2500._16_4_ * 1.1920929e-07;
        auVar42._16_4_ = fVar127;
        fVar128 = local_2500._20_4_ * 1.1920929e-07;
        auVar42._20_4_ = fVar128;
        fVar129 = local_2500._24_4_ * 1.1920929e-07;
        auVar42._24_4_ = fVar129;
        auVar42._28_4_ = 0x34000000;
        auVar115._0_8_ = CONCAT44(fVar124,fVar119) ^ 0x8000000080000000;
        auVar115._8_4_ = -fVar125;
        auVar115._12_4_ = -fVar126;
        auVar115._16_4_ = -fVar127;
        auVar115._20_4_ = -fVar128;
        auVar115._24_4_ = -fVar129;
        auVar115._28_4_ = 0xb4000000;
        auVar80 = vcmpps_avx(auVar80,auVar115,5);
        local_24e0 = ZEXT1632(auVar76);
        auVar86 = vmaxps_avx(ZEXT1632(auVar76),local_2800);
        auVar93 = vmaxps_avx(auVar86,ZEXT1632(auVar91));
        auVar93 = vcmpps_avx(auVar93,auVar42,2);
        auVar93 = vorps_avx(auVar80,auVar93);
        if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar93 >> 0x7f,0) != '\0') ||
              (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar93 >> 0xbf,0) != '\0') ||
            (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar93[0x1f] < '\0') {
          auVar43._4_4_ = fVar110 * local_2400._4_4_;
          auVar43._0_4_ = fVar107 * local_2400._0_4_;
          auVar43._8_4_ = fVar12 * local_2400._8_4_;
          auVar43._12_4_ = fVar15 * local_2400._12_4_;
          auVar43._16_4_ = fVar18 * local_2400._16_4_;
          auVar43._20_4_ = fVar21 * local_2400._20_4_;
          auVar43._24_4_ = fVar24 * local_2400._24_4_;
          auVar43._28_4_ = auVar80._28_4_;
          auVar44._4_4_ = fVar109 * local_2420._4_4_;
          auVar44._0_4_ = fVar106 * local_2420._0_4_;
          auVar44._8_4_ = fVar11 * local_2420._8_4_;
          auVar44._12_4_ = fVar14 * local_2420._12_4_;
          auVar44._16_4_ = fVar17 * local_2420._16_4_;
          auVar44._20_4_ = fVar20 * local_2420._20_4_;
          auVar44._24_4_ = fVar23 * local_2420._24_4_;
          auVar44._28_4_ = 0x34000000;
          auVar91 = vfmsub213ps_fma(local_2420,local_24a0,auVar43);
          auVar45._4_4_ = auVar26._4_4_ * fVar108;
          auVar45._0_4_ = auVar26._0_4_ * fVar105;
          auVar45._8_4_ = auVar26._8_4_ * fVar10;
          auVar45._12_4_ = auVar26._12_4_ * fVar13;
          auVar45._16_4_ = auVar26._16_4_ * fVar16;
          auVar45._20_4_ = auVar26._20_4_ * fVar19;
          auVar45._24_4_ = auVar26._24_4_ * fVar22;
          auVar45._28_4_ = auVar86._28_4_;
          auVar46._4_4_ = fVar109 * auVar27._4_4_;
          auVar46._0_4_ = fVar106 * auVar27._0_4_;
          auVar46._8_4_ = fVar11 * auVar27._8_4_;
          auVar46._12_4_ = fVar14 * auVar27._12_4_;
          auVar46._16_4_ = fVar17 * auVar27._16_4_;
          auVar46._20_4_ = fVar20 * auVar27._20_4_;
          auVar46._24_4_ = fVar23 * auVar27._24_4_;
          auVar46._28_4_ = local_2500._28_4_;
          auVar77 = vfmsub213ps_fma(auVar27,local_2480,auVar45);
          auVar80 = vandps_avx(auVar43,auVar84);
          auVar86 = vandps_avx(auVar45,auVar84);
          auVar80 = vcmpps_avx(auVar80,auVar86,1);
          local_27c0 = vblendvps_avx(ZEXT1632(auVar77),ZEXT1632(auVar91),auVar80);
          auVar47._4_4_ = fVar110 * auVar29._4_4_;
          auVar47._0_4_ = fVar107 * auVar29._0_4_;
          auVar47._8_4_ = fVar12 * auVar29._8_4_;
          auVar47._12_4_ = fVar15 * auVar29._12_4_;
          auVar47._16_4_ = fVar18 * auVar29._16_4_;
          auVar47._20_4_ = fVar21 * auVar29._20_4_;
          auVar47._24_4_ = fVar24 * auVar29._24_4_;
          auVar47._28_4_ = auVar80._28_4_;
          auVar91 = vfmsub213ps_fma(auVar29,local_24a0,auVar46);
          auVar48._4_4_ = local_23e0._4_4_ * fVar108;
          auVar48._0_4_ = local_23e0._0_4_ * fVar105;
          auVar48._8_4_ = local_23e0._8_4_ * fVar10;
          auVar48._12_4_ = local_23e0._12_4_ * fVar13;
          auVar48._16_4_ = local_23e0._16_4_ * fVar16;
          auVar48._20_4_ = local_23e0._20_4_ * fVar19;
          auVar48._24_4_ = local_23e0._24_4_ * fVar22;
          auVar48._28_4_ = auVar86._28_4_;
          auVar77 = vfmsub213ps_fma(local_2400,local_24c0,auVar48);
          auVar80 = vandps_avx(auVar48,auVar84);
          auVar86 = vandps_avx(auVar46,auVar84);
          auVar80 = vcmpps_avx(auVar80,auVar86,1);
          local_27a0 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar77),auVar80);
          auVar91 = vfmsub213ps_fma(local_23e0,local_2480,auVar44);
          auVar77 = vfmsub213ps_fma(auVar26,local_24c0,auVar47);
          auVar80 = vandps_avx(auVar44,auVar84);
          auVar86 = vandps_avx(auVar47,auVar84);
          auVar86 = vcmpps_avx(auVar80,auVar86,1);
          local_2780 = vblendvps_avx(ZEXT1632(auVar77),ZEXT1632(auVar91),auVar86);
          auVar91 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
          fVar119 = local_2780._0_4_;
          auVar85._0_4_ = fVar119 * local_2460;
          fVar105 = local_2780._4_4_;
          auVar85._4_4_ = fVar105 * local_2460;
          fVar106 = local_2780._8_4_;
          auVar85._8_4_ = fVar106 * local_2460;
          fVar107 = local_2780._12_4_;
          auVar85._12_4_ = fVar107 * local_2460;
          fVar108 = local_2780._16_4_;
          auVar85._16_4_ = fVar108 * local_2460;
          fVar109 = local_2780._20_4_;
          auVar85._20_4_ = fVar109 * local_2460;
          fVar110 = local_2780._24_4_;
          auVar85._24_4_ = fVar110 * local_2460;
          auVar85._28_4_ = 0;
          auVar77 = vfmadd213ps_fma(auVar133,local_27a0,auVar85);
          auVar77 = vfmadd213ps_fma(local_2440,local_27c0,ZEXT1632(auVar77));
          auVar86 = ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                       CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                CONCAT44(auVar77._4_4_ + auVar77._4_4_,
                                                         auVar77._0_4_ + auVar77._0_4_))));
          auVar49._4_4_ = fVar105 * fVar2;
          auVar49._0_4_ = fVar119 * fVar1;
          auVar49._8_4_ = fVar106 * fVar3;
          auVar49._12_4_ = fVar107 * fVar25;
          auVar49._16_4_ = fVar108 * fVar7;
          auVar49._20_4_ = fVar109 * fVar8;
          auVar49._24_4_ = fVar110 * fVar9;
          auVar49._28_4_ = auVar80._28_4_;
          auVar77 = vfmadd213ps_fma(local_2900,local_27a0,auVar49);
          auVar102 = vfmadd213ps_fma(auVar94,local_27c0,ZEXT1632(auVar77));
          auVar80 = vrcpps_avx(auVar86);
          auVar130._8_4_ = 0x3f800000;
          auVar130._0_8_ = &DAT_3f8000003f800000;
          auVar130._12_4_ = 0x3f800000;
          auVar130._16_4_ = 0x3f800000;
          auVar130._20_4_ = 0x3f800000;
          auVar130._24_4_ = 0x3f800000;
          auVar130._28_4_ = 0x3f800000;
          auVar77 = vfnmadd213ps_fma(auVar80,auVar86,auVar130);
          auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar80,auVar80);
          local_2700._28_4_ = 0x3f800000;
          local_2700._0_28_ =
               ZEXT1628(CONCAT412(auVar77._12_4_ * (auVar102._12_4_ + auVar102._12_4_),
                                  CONCAT48(auVar77._8_4_ * (auVar102._8_4_ + auVar102._8_4_),
                                           CONCAT44(auVar77._4_4_ *
                                                    (auVar102._4_4_ + auVar102._4_4_),
                                                    auVar77._0_4_ *
                                                    (auVar102._0_4_ + auVar102._0_4_)))));
          auVar75 = ZEXT3264(local_2700);
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar100._4_4_ = uVar69;
          auVar100._0_4_ = uVar69;
          auVar100._8_4_ = uVar69;
          auVar100._12_4_ = uVar69;
          auVar100._16_4_ = uVar69;
          auVar100._20_4_ = uVar69;
          auVar100._24_4_ = uVar69;
          auVar100._28_4_ = uVar69;
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar117._4_4_ = uVar69;
          auVar117._0_4_ = uVar69;
          auVar117._8_4_ = uVar69;
          auVar117._12_4_ = uVar69;
          auVar117._16_4_ = uVar69;
          auVar117._20_4_ = uVar69;
          auVar117._24_4_ = uVar69;
          auVar117._28_4_ = uVar69;
          auVar80 = vcmpps_avx(auVar100,local_2700,2);
          auVar93 = vcmpps_avx(local_2700,auVar117,2);
          auVar80 = vandps_avx(auVar93,auVar80);
          auVar77 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
          auVar91 = vpand_avx(auVar77,auVar91);
          auVar80 = vpmovsxwd_avx2(auVar91);
          if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar80 >> 0x7f,0) != '\0') ||
                (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar80 >> 0xbf,0) != '\0') ||
              (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar80[0x1f] < '\0') {
            auVar80 = vcmpps_avx(auVar86,_DAT_02020f00,4);
            auVar77 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
            auVar91 = vpand_avx(auVar91,auVar77);
            local_2980 = vpmovsxwd_avx2(auVar91);
            if ((((((((local_2980 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_2980 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2980 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2980 >> 0x7f,0) != '\0') ||
                  (local_2980 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_2980 >> 0xbf,0) != '\0') ||
                (local_2980 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_2980[0x1f] < '\0') {
              local_2820 = ZEXT1632(auVar76);
              local_2760 = local_2980;
              local_2680 = local_2520;
              auVar80 = vrcpps_avx(local_27e0);
              auVar122._8_4_ = 0x3f800000;
              auVar122._0_8_ = &DAT_3f8000003f800000;
              auVar122._12_4_ = 0x3f800000;
              auVar122._16_4_ = 0x3f800000;
              auVar122._20_4_ = 0x3f800000;
              auVar122._24_4_ = 0x3f800000;
              auVar122._28_4_ = 0x3f800000;
              auVar77 = vfnmadd213ps_fma(local_27e0,auVar80,auVar122);
              auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar80,auVar80);
              auVar101._8_4_ = 0x219392ef;
              auVar101._0_8_ = 0x219392ef219392ef;
              auVar101._12_4_ = 0x219392ef;
              auVar101._16_4_ = 0x219392ef;
              auVar101._20_4_ = 0x219392ef;
              auVar101._24_4_ = 0x219392ef;
              auVar101._28_4_ = 0x219392ef;
              auVar80 = vcmpps_avx(local_2500,auVar101,5);
              auVar80 = vandps_avx(auVar80,ZEXT1632(auVar77));
              auVar50._4_4_ = auVar76._4_4_ * auVar80._4_4_;
              auVar50._0_4_ = auVar76._0_4_ * auVar80._0_4_;
              auVar50._8_4_ = auVar76._8_4_ * auVar80._8_4_;
              auVar50._12_4_ = auVar76._12_4_ * auVar80._12_4_;
              auVar50._16_4_ = auVar80._16_4_ * 0.0;
              auVar50._20_4_ = auVar80._20_4_ * 0.0;
              auVar50._24_4_ = auVar80._24_4_ * 0.0;
              auVar50._28_4_ = 0;
              auVar93 = vminps_avx(auVar50,auVar122);
              auVar51._4_4_ = auVar88._4_4_ * auVar80._4_4_;
              auVar51._0_4_ = auVar88._0_4_ * auVar80._0_4_;
              auVar51._8_4_ = auVar88._8_4_ * auVar80._8_4_;
              auVar51._12_4_ = auVar88._12_4_ * auVar80._12_4_;
              auVar51._16_4_ = auVar80._16_4_ * 0.0;
              auVar51._20_4_ = auVar80._20_4_ * 0.0;
              auVar51._24_4_ = auVar80._24_4_ * 0.0;
              auVar51._28_4_ = local_24a0._28_4_;
              auVar80 = vminps_avx(auVar51,auVar122);
              auVar86 = vsubps_avx(auVar122,auVar93);
              auVar94 = vsubps_avx(auVar122,auVar80);
              local_2720 = vblendvps_avx(auVar80,auVar86,local_2520);
              local_2740 = vblendvps_avx(auVar93,auVar94,local_2520);
              local_26e0[0] = local_27c0._0_4_ * (float)local_2540._0_4_;
              local_26e0[1] = local_27c0._4_4_ * (float)local_2540._4_4_;
              local_26e0[2] = local_27c0._8_4_ * fStack_2538;
              local_26e0[3] = local_27c0._12_4_ * fStack_2534;
              fStack_26d0 = local_27c0._16_4_ * fStack_2530;
              fStack_26cc = local_27c0._20_4_ * fStack_252c;
              fStack_26c8 = local_27c0._24_4_ * fStack_2528;
              uStack_26c4 = local_2740._28_4_;
              local_26c0[0] = (float)local_2540._0_4_ * local_27a0._0_4_;
              local_26c0[1] = (float)local_2540._4_4_ * local_27a0._4_4_;
              local_26c0[2] = fStack_2538 * local_27a0._8_4_;
              local_26c0[3] = fStack_2534 * local_27a0._12_4_;
              fStack_26b0 = fStack_2530 * local_27a0._16_4_;
              fStack_26ac = fStack_252c * local_27a0._20_4_;
              fStack_26a8 = fStack_2528 * local_27a0._24_4_;
              uStack_26a4 = local_2720._28_4_;
              local_26a0[0] = (float)local_2540._0_4_ * fVar119;
              local_26a0[1] = (float)local_2540._4_4_ * fVar105;
              local_26a0[2] = fStack_2538 * fVar106;
              local_26a0[3] = fStack_2534 * fVar107;
              fStack_2690 = fStack_2530 * fVar108;
              fStack_268c = fStack_252c * fVar109;
              fStack_2688 = fStack_2528 * fVar110;
              uStack_2684 = uStack_2524;
              auVar80 = vpmovsxwd_avx2(auVar91);
              auVar90._8_4_ = 0x7f800000;
              auVar90._0_8_ = 0x7f8000007f800000;
              auVar90._12_4_ = 0x7f800000;
              auVar90._16_4_ = 0x7f800000;
              auVar90._20_4_ = 0x7f800000;
              auVar90._24_4_ = 0x7f800000;
              auVar90._28_4_ = 0x7f800000;
              auVar80 = vblendvps_avx(auVar90,local_2700,auVar80);
              auVar93 = vshufps_avx(auVar80,auVar80,0xb1);
              auVar93 = vminps_avx(auVar80,auVar93);
              auVar86 = vshufpd_avx(auVar93,auVar93,5);
              auVar93 = vminps_avx(auVar93,auVar86);
              auVar86 = vpermpd_avx2(auVar93,0x4e);
              auVar93 = vminps_avx(auVar93,auVar86);
              auVar80 = vcmpps_avx(auVar80,auVar93,0);
              auVar76 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
              auVar76 = vpand_avx(auVar76,auVar91);
              auVar80 = vpmovsxwd_avx2(auVar76);
              if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar80 >> 0x7f,0) == '\0') &&
                    (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar80 >> 0xbf,0) == '\0') &&
                  (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar80[0x1f]) {
                auVar80 = local_2980;
              }
              uVar55 = vmovmskps_avx(auVar80);
              uVar56 = 0;
              for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
                uVar56 = uVar56 + 1;
              }
              auStack_29d8 = auVar133._8_24_;
              local_29e0 = context->scene;
              pSVar58 = context->scene;
              do {
                uVar61 = (ulong)uVar56;
                uVar56 = *(uint *)((long)&local_23c0 + uVar61 * 4);
                pGVar5 = (pSVar58->geometries).items[uVar56].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2980 + uVar61 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar69 = *(undefined4 *)(local_2740 + uVar61 * 4);
                    uVar4 = *(undefined4 *)(local_2720 + uVar61 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_26e0[uVar61 - 8];
                    *(float *)(ray + k * 4 + 0xc0) = local_26e0[uVar61];
                    *(float *)(ray + k * 4 + 0xd0) = local_26c0[uVar61];
                    *(float *)(ray + k * 4 + 0xe0) = local_26a0[uVar61];
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar69;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_28e0 + uVar61 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar56;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  uVar69 = *(undefined4 *)(local_2740 + uVar61 * 4);
                  local_2880._4_4_ = uVar69;
                  local_2880._0_4_ = uVar69;
                  local_2880._8_4_ = uVar69;
                  local_2880._12_4_ = uVar69;
                  uVar69 = *(undefined4 *)(local_2720 + uVar61 * 4);
                  auVar78._4_4_ = uVar69;
                  auVar78._0_4_ = uVar69;
                  auVar78._8_4_ = uVar69;
                  auVar78._12_4_ = uVar69;
                  local_2850._4_4_ = uVar56;
                  local_2850._0_4_ = uVar56;
                  local_2850._8_4_ = uVar56;
                  local_2850._12_4_ = uVar56;
                  uVar69 = *(undefined4 *)((long)&local_28e0 + uVar61 * 4);
                  auVar92._4_4_ = uVar69;
                  auVar92._0_4_ = uVar69;
                  auVar92._8_4_ = uVar69;
                  auVar92._12_4_ = uVar69;
                  fVar1 = local_26e0[uVar61];
                  fVar2 = local_26c0[uVar61];
                  local_28a0._4_4_ = fVar2;
                  local_28a0._0_4_ = fVar2;
                  local_28a0._8_4_ = fVar2;
                  local_28a0._12_4_ = fVar2;
                  fVar2 = local_26a0[uVar61];
                  local_2890._4_4_ = fVar2;
                  local_2890._0_4_ = fVar2;
                  local_2890._8_4_ = fVar2;
                  local_2890._12_4_ = fVar2;
                  local_28b0[0] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_28b0[4] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_28b0[8] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_28b0[0xc] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_2870 = auVar78;
                  local_2860 = auVar92;
                  vpcmpeqd_avx2(ZEXT1632(local_2880),ZEXT1632(local_2880));
                  uStack_283c = context->user->instID[0];
                  local_2840 = uStack_283c;
                  uStack_2838 = uStack_283c;
                  uStack_2834 = uStack_283c;
                  uStack_2830 = context->user->instPrimID[0];
                  uStack_282c = uStack_2830;
                  uStack_2828 = uStack_2830;
                  uStack_2824 = uStack_2830;
                  local_2900._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  *(float *)(ray + k * 4 + 0x80) = local_26e0[uVar61 - 8];
                  local_2a10 = *local_2a00;
                  uStack_2a08 = local_2a00[1];
                  local_29b0.valid = (int *)&local_2a10;
                  local_29b0.geometryUserPtr = pGVar5->userPtr;
                  local_29b0.context = context->user;
                  local_29b0.hit = local_28b0;
                  local_29b0.N = 4;
                  local_2960 = auVar75._0_32_;
                  local_29b0.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_2920._0_8_ = pauVar67;
                    (*pGVar5->intersectionFilterN)(&local_29b0);
                    auVar75._8_56_ = extraout_var;
                    auVar75._0_8_ = extraout_XMM1_Qa;
                    auVar78 = auVar75._0_16_;
                    auVar75 = ZEXT3264(local_2960);
                    pauVar67 = (undefined1 (*) [16])local_2920._0_8_;
                  }
                  auVar52._8_8_ = uStack_2a08;
                  auVar52._0_8_ = local_2a10;
                  if (auVar52 == (undefined1  [16])0x0) {
                    auVar76 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar88 = vpcmpeqd_avx(auVar78,auVar78);
                    auVar76 = auVar76 ^ auVar88;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    auVar88 = vpcmpeqd_avx(auVar92,auVar92);
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&local_29b0);
                      auVar75 = ZEXT3264(local_2960);
                      auVar88 = vpcmpeqd_avx(auVar88,auVar88);
                    }
                    auVar53._8_8_ = uStack_2a08;
                    auVar53._0_8_ = local_2a10;
                    auVar91 = vpcmpeqd_avx(auVar53,_DAT_01feba10);
                    auVar76 = auVar91 ^ auVar88;
                    if (auVar53 != (undefined1  [16])0x0) {
                      auVar91 = auVar91 ^ auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])local_29b0.hit);
                      *(undefined1 (*) [16])(local_29b0.ray + 0xc0) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0xd0) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0xe0) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0xf0) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x100) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x110) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x120) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x130) = auVar88;
                      auVar88 = vmaskmovps_avx(auVar91,*(undefined1 (*) [16])(local_29b0.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_29b0.ray + 0x140) = auVar88;
                    }
                  }
                  auVar79._8_8_ = 0x100000001;
                  auVar79._0_8_ = 0x100000001;
                  if ((auVar79 & auVar76) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_2900._0_4_;
                  }
                  *(undefined4 *)(local_2980 + uVar61 * 4) = 0;
                  uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar74._4_4_ = uVar69;
                  auVar74._0_4_ = uVar69;
                  auVar74._8_4_ = uVar69;
                  auVar74._12_4_ = uVar69;
                  auVar74._16_4_ = uVar69;
                  auVar74._20_4_ = uVar69;
                  auVar74._24_4_ = uVar69;
                  auVar74._28_4_ = uVar69;
                  auVar80 = vcmpps_avx(auVar75._0_32_,auVar74,2);
                  local_2980 = vandps_avx(auVar80,local_2980);
                }
                if ((((((((local_2980 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2980 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2980 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2980 >> 0x7f,0) == '\0') &&
                      (local_2980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2980 >> 0xbf,0) == '\0') &&
                    (local_2980 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2980[0x1f]) break;
                auVar87._8_4_ = 0x7f800000;
                auVar87._0_8_ = 0x7f8000007f800000;
                auVar87._12_4_ = 0x7f800000;
                auVar87._16_4_ = 0x7f800000;
                auVar87._20_4_ = 0x7f800000;
                auVar87._24_4_ = 0x7f800000;
                auVar87._28_4_ = 0x7f800000;
                auVar80 = vblendvps_avx(auVar87,auVar75._0_32_,local_2980);
                auVar93 = vshufps_avx(auVar80,auVar80,0xb1);
                auVar93 = vminps_avx(auVar80,auVar93);
                auVar86 = vshufpd_avx(auVar93,auVar93,5);
                auVar93 = vminps_avx(auVar93,auVar86);
                auVar86 = vpermpd_avx2(auVar93,0x4e);
                auVar93 = vminps_avx(auVar93,auVar86);
                auVar93 = vcmpps_avx(auVar80,auVar93,0);
                auVar86 = local_2980 & auVar93;
                auVar80 = local_2980;
                if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar86 >> 0x7f,0) != '\0') ||
                      (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar86 >> 0xbf,0) != '\0') ||
                    (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar86[0x1f] < '\0') {
                  auVar80 = vandps_avx(auVar93,local_2980);
                }
                uVar55 = vmovmskps_avx(auVar80);
                uVar56 = 0;
                for (; pSVar58 = local_29e0, (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x80000000) {
                  uVar56 = uVar56 + 1;
                }
              } while( true );
            }
          }
        }
        lVar64 = lVar64 + 1;
      } while (lVar64 != uVar70 - 8);
    }
    uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar75 = ZEXT3264(CONCAT428(uVar69,CONCAT424(uVar69,CONCAT420(uVar69,CONCAT416(uVar69,CONCAT412
                                                  (uVar69,CONCAT48(uVar69,CONCAT44(uVar69,uVar69))))
                                                  ))));
    auVar112 = ZEXT3264(local_2560);
    auVar116 = ZEXT3264(local_2580);
    auVar118 = ZEXT3264(local_25a0);
    auVar123 = ZEXT3264(local_25c0);
    auVar131 = ZEXT3264(local_25e0);
    auVar134 = ZEXT3264(local_2600);
    auVar135 = ZEXT3264(local_2620);
    auVar137 = ZEXT3264(local_2640);
    auVar139 = ZEXT3264(local_2660);
    auVar141 = ZEXT3264(local_2940);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }